

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void compareUnit(UnitsPtr *u1,UnitsPtr *u2)

{
  string *psVar1;
  string *psVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  AssertHelper local_128 [8];
  Message local_120 [8];
  string id1;
  string prefix1;
  string reference1;
  double multiplier2;
  double exponent2;
  double multiplier1;
  double exponent1;
  string id2;
  string prefix2;
  string reference2;
  
  prefix1._M_dataplus._M_p = (pointer)libcellml::Units::unitCount();
  id1._M_dataplus._M_p = (pointer)libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&reference1,"u1->unitCount()","u2->unitCount()",(unsigned_long *)&prefix1,
             (unsigned_long *)&id1);
  if ((char)reference1._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&prefix1);
    if (reference1._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)reference1._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&id1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x13c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&id1,(Message *)&prefix1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&id1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&prefix1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&reference1._M_string_length);
  reference1._M_dataplus._M_p = (pointer)&reference1.field_2;
  reference1._M_string_length = 0;
  psVar2 = (string *)0x0;
  prefix1._M_dataplus._M_p = (pointer)&prefix1.field_2;
  prefix1._M_string_length = 0;
  reference1.field_2._M_local_buf[0] = '\0';
  prefix1.field_2._M_local_buf[0] = '\0';
  id1._M_dataplus._M_p = (pointer)&id1.field_2;
  id1._M_string_length = 0;
  reference2._M_dataplus._M_p = (pointer)&reference2.field_2;
  reference2._M_string_length = 0;
  id1.field_2._M_local_buf[0] = '\0';
  reference2.field_2._M_local_buf[0] = '\0';
  prefix2._M_dataplus._M_p = (pointer)&prefix2.field_2;
  prefix2._M_string_length = 0;
  id2._M_dataplus._M_p = (pointer)&id2.field_2;
  id2._M_string_length = 0;
  prefix2.field_2._M_local_buf[0] = '\0';
  id2.field_2._M_local_buf[0] = '\0';
  while( true ) {
    psVar1 = (string *)libcellml::Units::unitCount();
    if (psVar1 <= psVar2) break;
    libcellml::Units::unitAttributes
              ((ulong)(u1->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               psVar2,(string *)&reference1,(double *)&prefix1,&exponent1,(string *)&multiplier1);
    libcellml::Units::unitAttributes
              ((ulong)(u2->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               psVar2,(string *)&reference2,(double *)&prefix2,&exponent2,(string *)&multiplier2);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"reference1","reference2",&reference1,&reference2);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message(local_120);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14c,pcVar3);
      testing::internal::AssertHelper::operator=(local_128,local_120);
      testing::internal::AssertHelper::~AssertHelper(local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_120);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"prefix1","prefix2",&prefix1,&prefix2);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message(local_120);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14d,pcVar3);
      testing::internal::AssertHelper::operator=(local_128,local_120);
      testing::internal::AssertHelper::~AssertHelper(local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_120);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_1,"exponent1","exponent2",&exponent1,&exponent2);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message(local_120);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14e,pcVar3);
      testing::internal::AssertHelper::operator=(local_128,local_120);
      testing::internal::AssertHelper::~AssertHelper(local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_120);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_1,"multiplier1","multiplier2",&multiplier1,&multiplier2);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message(local_120);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x14f,pcVar3);
      testing::internal::AssertHelper::operator=(local_128,local_120);
      testing::internal::AssertHelper::~AssertHelper(local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_120);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"id1","id2",&id1,&id2);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message(local_120);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0x150,pcVar3);
      testing::internal::AssertHelper::operator=(local_128,local_120);
      testing::internal::AssertHelper::~AssertHelper(local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_120);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    psVar2 = psVar2 + 1;
  }
  std::__cxx11::string::~string((string *)&id2);
  std::__cxx11::string::~string((string *)&prefix2);
  std::__cxx11::string::~string((string *)&reference2);
  std::__cxx11::string::~string((string *)&id1);
  std::__cxx11::string::~string((string *)&prefix1);
  std::__cxx11::string::~string((string *)&reference1);
  return;
}

Assistant:

void compareUnit(const libcellml::UnitsPtr &u1, const libcellml::UnitsPtr &u2)
{
    EXPECT_EQ(u1->unitCount(), u2->unitCount());

    std::string reference1;
    std::string prefix1;
    std::string id1;
    std::string reference2;
    std::string prefix2;
    std::string id2;
    double exponent1;
    double multiplier1;
    double exponent2;
    double multiplier2;
    for (size_t index = 0; index < u1->unitCount(); ++index) {
        u1->unitAttributes(index, reference1, prefix1, exponent1, multiplier1, id1);
        u2->unitAttributes(index, reference2, prefix2, exponent2, multiplier2, id2);

        EXPECT_EQ(reference1, reference2);
        EXPECT_EQ(prefix1, prefix2);
        EXPECT_EQ(exponent1, exponent2);
        EXPECT_EQ(multiplier1, multiplier2);
        EXPECT_EQ(id1, id2);
    }
}